

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlCatalogNormalizePublic(xmlChar *pubID)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  
  if (pubID == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  bVar6 = *pubID;
  if (bVar6 != 0) {
    pbVar4 = pubID + 1;
    bVar2 = true;
    do {
      bVar3 = false;
      if (bVar6 < 0x21) {
        bVar1 = true;
        if ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) != 0) {
          bVar1 = !bVar2 && bVar6 == 0x20;
          bVar3 = bVar2;
          if (!bVar2 && bVar6 == 0x20) {
            bVar3 = true;
          }
        }
      }
      else {
        bVar1 = true;
      }
      bVar2 = bVar3;
      if (!bVar1) break;
      bVar6 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (bVar6 != 0);
    if (!bVar2 && bVar1) {
      return (xmlChar *)0x0;
    }
  }
  pbVar5 = xmlStrdup(pubID);
  bVar2 = false;
  pbVar4 = pbVar5;
  do {
    uVar7 = (ulong)*pubID;
    if (uVar7 < 0x21) {
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0) {
          *pbVar4 = 0;
          return pbVar5;
        }
        goto LAB_0013c607;
      }
      if (pbVar4 != pbVar5) {
        bVar2 = true;
      }
    }
    else {
LAB_0013c607:
      if (bVar2) {
        *pbVar4 = 0x20;
        pbVar4 = pbVar4 + 1;
      }
      *pbVar4 = *pubID;
      pbVar4 = pbVar4 + 1;
      bVar2 = false;
    }
    pubID = pubID + 1;
  } while( true );
}

Assistant:

static xmlChar *
xmlCatalogNormalizePublic(const xmlChar *pubID)
{
    int ok = 1;
    int white;
    const xmlChar *p;
    xmlChar *ret;
    xmlChar *q;

    if (pubID == NULL)
        return(NULL);

    white = 1;
    for (p = pubID;*p != 0 && ok;p++) {
        if (!xmlIsBlank_ch(*p))
            white = 0;
        else if (*p == 0x20 && !white)
            white = 1;
        else
            ok = 0;
    }
    if (ok && !white)	/* is normalized */
        return(NULL);

    ret = xmlStrdup(pubID);
    q = ret;
    white = 0;
    for (p = pubID;*p != 0;p++) {
        if (xmlIsBlank_ch(*p)) {
            if (q != ret)
                white = 1;
        } else {
            if (white) {
                *(q++) = 0x20;
                white = 0;
            }
            *(q++) = *p;
        }
    }
    *q = 0;
    return(ret);
}